

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O0

Matrix<double,_3,_9,_0,_3,_9> *
mnf::ExpMapMatrix::diffPseudoLog0_
          (Matrix<double,_3,_9,_0,_3,_9> *__return_storage_ptr__,ConstRefVec *R)

{
  math *this;
  CoeffReturnType CVar1;
  CoeffReturnType CVar2;
  CoeffReturnType CVar3;
  double x_00;
  type tVar4;
  RealScalar RVar5;
  ColXpr local_3c0;
  ColXpr local_390;
  ColXpr local_360;
  Scalar local_330;
  Scalar local_328;
  double local_320;
  Matrix<double,_3,_1,_0,_3,_1> local_318;
  ColXpr local_300;
  Scalar local_2d0;
  Scalar local_2c8;
  Matrix<double,_3,_1,_0,_3,_1> local_2c0;
  ColXpr local_2a8;
  Scalar local_278;
  Scalar local_270;
  Matrix<double,_3,_1,_0,_3,_1> local_268;
  ColXpr local_250;
  ColXpr local_220;
  ColXpr local_1f0;
  double local_1c0;
  Scalar local_1b8;
  Scalar local_1b0;
  Matrix<double,_3,_1,_0,_3,_1> local_1a8;
  ColXpr local_190;
  Scalar local_160;
  double local_158;
  Scalar local_150;
  Matrix<double,_3,_1,_0,_3,_1> local_148;
  ColXpr local_130;
  Scalar local_100;
  Scalar local_f8;
  Matrix<double,_3,_1,_0,_3,_1> local_f0;
  ColXpr local_d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_a8;
  double local_80;
  double x;
  double df;
  double hf;
  double f;
  double s2;
  double trRm1o2;
  double trR;
  double local_40;
  double local_38;
  undefined1 local_30 [8];
  Vector3d v;
  ConstRefVec *R_local;
  Matrix<double,_3,_9,_0,_3,_9> *J;
  
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)R;
  Eigen::Matrix<double,_3,_9,_0,_3,_9>::Matrix(__return_storage_ptr__);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__);
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],5);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],7);
  local_38 = (CVar1 - CVar2) / 2.0;
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],6);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],2);
  local_40 = (CVar1 - CVar2) / 2.0;
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],1);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],3);
  trR = (CVar1 - CVar2) / 2.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_30,&local_38,&local_40,&trR);
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],0);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],4);
  this = (math *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],8);
  trRm1o2 = CVar1 + CVar2 + CVar3;
  s2 = (trRm1o2 - 1.0) / 2.0;
  f = -s2 * s2 + 1.0;
  x_00 = acos(s2);
  tVar4 = boost::math::sinc_pi<double>(this,x_00);
  hf = 1.0 / tVar4;
  df = hf / 2.0;
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::squaredNorm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  if (1e-10 <= RVar5) {
    x = (s2 * hf + -1.0) / (f * 2.0);
  }
  else {
    local_80 = trRm1o2 - 3.0;
    x = (((trRm1o2 / 15.0 - (local_80 * local_80 * 3.0) / 140.0) +
         (local_80 * local_80 * local_80 * 2.0) / 315.0) -
        (local_80 * local_80 * local_80 * local_80 * 5.0) / 2772.0) - 0.0;
  }
  Eigen::operator*(&local_a8,&x,(StorageBaseType *)local_30);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_d8,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,0)
  ;
  Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true> *)&local_d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a8);
  local_f8 = 0.0;
  local_100 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_f0,&local_f8,&local_100,&df);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_130,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,1
            );
  Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true> *)&local_130,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_f0);
  local_150 = 0.0;
  local_158 = -df;
  local_160 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_148,&local_150,&local_158,&local_160);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_190,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,2
            );
  Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true> *)&local_190,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_148);
  local_1b0 = 0.0;
  local_1b8 = 0.0;
  local_1c0 = -df;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_1a8,&local_1b0,&local_1b8,&local_1c0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_1f0,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,3
            );
  Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true> *)&local_1f0,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1a8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_220,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,0
            );
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_250,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,4
            );
  Eigen::Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true>::operator=(&local_250,&local_220);
  local_270 = 0.0;
  local_278 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_268,&df,&local_270,&local_278);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_2a8,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,5
            );
  Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true> *)&local_2a8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_268);
  local_2c8 = 0.0;
  local_2d0 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_2c0,&local_2c8,&df,&local_2d0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_300,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,6
            );
  Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true> *)&local_300,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2c0);
  local_320 = -df;
  local_328 = 0.0;
  local_330 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_318,&local_320,&local_328,&local_330);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_360,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,7
            );
  Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true> *)&local_360,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_318);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_390,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,0
            );
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::col
            (&local_3c0,(DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__,8
            );
  Eigen::Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true>::operator=(&local_3c0,&local_390);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 3, 9> ExpMapMatrix::diffPseudoLog0_(const ConstRefVec& R)
{
  Eigen::Matrix<double, 3, 9> J;
  J.setZero();
  // Valid approximation of the log when v<<1
  Eigen::Vector3d v((R(5) - R(7)) / 2, (R(6) - R(2)) / 2, (R(1) - R(3)) / 2);

  double trR = R(0) + R(4) + R(8);  // Trace of R;
  double trRm1o2 = (trR - 1) / 2;
  double s2 = 1 - trRm1o2 * trRm1o2;
  double f = 1 / boost::math::sinc_pi(
                     acos(trRm1o2));  //=acos(trRm1o2)/sin(acos(trRm1o2));
  double hf = f / 2;
  double df;
  if (v.squaredNorm() < 1e-10)  // Probably should not use this switch value
                                // here
  {
    // TODO: I do not know how to test that. Verification with finite
    // differences proved unefficient. Need to get back to it later.
    //
    // Here we use the Taylor approximation of the diff of the log
    double x = trR - 3;
    df = trR / 15 - (3 * (x * x)) / 140 + (2 * (x * x * x)) / 315 -
         (5 * (x * x * x * x)) / 2772 - 11 / 30;
  }
  else
  {
    df = (trRm1o2 * f - 1) / (2 * s2);
  }
  J.col(0) = df * v;
  J.col(1) = Eigen::Vector3d(0, 0, hf);
  J.col(2) = Eigen::Vector3d(0, -hf, 0);
  J.col(3) = Eigen::Vector3d(0, 0, -hf);
  J.col(4) = J.col(0);
  J.col(5) = Eigen::Vector3d(hf, 0, 0);
  J.col(6) = Eigen::Vector3d(0, hf, 0);
  J.col(7) = Eigen::Vector3d(-hf, 0, 0);
  J.col(8) = J.col(0);
  return J;
}